

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void rsg::(anonymous_namespace)::computeEqualityValueRange<true,bool>
               (Random *rnd,bool dstMin,bool dstMax,bool *aMin,bool *aMax,bool *bMin,bool *bMax)

{
  bool bVar1;
  bool val_1;
  bool val;
  bool *bMin_local;
  bool *aMax_local;
  bool *aMin_local;
  bool dstMax_local;
  bool dstMin_local;
  Random *rnd_local;
  
  if ((dstMin) || (!dstMax)) {
    if (dstMin) {
      bVar1 = de::Random::getBool(rnd);
      *aMin = bVar1;
      *aMax = bVar1;
      *bMin = bVar1;
      *bMax = bVar1;
    }
    else {
      bVar1 = de::Random::getBool(rnd);
      *aMin = bVar1;
      *aMax = bVar1;
      *bMin = (bool)((bVar1 ^ 0xffU) & 1);
      *bMax = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    *aMin = false;
    *aMax = true;
    *bMin = false;
    *bMax = true;
  }
  return;
}

Assistant:

void computeEqualityValueRange<true, bool> (de::Random& rnd, bool dstMin, bool dstMax, bool& aMin, bool& aMax, bool& bMin, bool& bMax)
{
	if (dstMin == false && dstMax == true)
	{
		aMin	= false;
		aMax	= true;
		bMin	= false;
		bMax	= true;
	}
	else if (dstMin == false)
	{
		DE_ASSERT(dstMax == false);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= !val;
		bMax	= !val;
	}
	else
	{
		DE_ASSERT(dstMin == true && dstMax == true);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= val;
		bMax	= val;
	}
}